

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

ON_PlaneEquation * __thiscall
ON_PlaneEquation::UnitizedPlaneEquation
          (ON_PlaneEquation *__return_storage_ptr__,ON_PlaneEquation *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  double dVar5;
  ON_PlaneEquation tmp;
  ON_PlaneEquation local_38;
  
  bVar4 = IsSet(this);
  if (bVar4) {
    dVar1 = this->x;
    dVar2 = this->y;
    dVar3 = this->z;
    dVar5 = ON_Length3d(dVar1,dVar2,dVar3);
    if (0x7fefffffffffffff < (ulong)ABS(dVar5)) goto LAB_0057bc8c;
    if (2.2250738585072014e-308 < dVar5) {
      local_38.x = dVar1 / dVar5;
      local_38.y = dVar2 / dVar5;
      local_38.z = dVar3 / dVar5;
      local_38.d = this->d;
    }
    else {
      if (dVar5 <= 0.0) {
LAB_0057bc8c:
        dVar3 = ZeroPlaneEquation.d;
        dVar2 = ZeroPlaneEquation.y;
        dVar1 = ZeroPlaneEquation.x;
        __return_storage_ptr__->z = ZeroPlaneEquation.z;
        __return_storage_ptr__->d = dVar3;
        __return_storage_ptr__->x = dVar1;
        __return_storage_ptr__->y = dVar2;
        return __return_storage_ptr__;
      }
      ON_PlaneEquation(&local_38,dVar1 * 8.98846567431158e+307,dVar2 * 8.98846567431158e+307,
                       dVar3 * 8.98846567431158e+307,this->d * 8.98846567431158e+307);
      dVar5 = ON_Length3d(local_38.x,local_38.y,local_38.z);
      if (dVar5 <= 2.2250738585072014e-308 || 0x7fefffffffffffff < (ulong)ABS(dVar5))
      goto LAB_0057bc8c;
      local_38.x = local_38.x / dVar5;
      local_38.y = local_38.y / dVar5;
      local_38.z = local_38.z / dVar5;
    }
    local_38.d = local_38.d / dVar5;
  }
  else {
    if ((((this->d != -1.23432101234321e+308) || (NAN(this->d))) ||
        (ON_3dVector::ON_3dVector((ON_3dVector *)&local_38,this->x,this->y,this->z),
        1.23432101234321e+308 <= ABS(local_38.x))) ||
       (((1.23432101234321e+308 <= ABS(local_38.y) || (1.23432101234321e+308 <= ABS(local_38.z))) ||
        (bVar4 = ON_3dVector::Unitize((ON_3dVector *)&local_38), !bVar4)))) goto LAB_0057bc8c;
    local_38.d = -1.23432101234321e+308;
  }
  ON_PlaneEquation(__return_storage_ptr__,local_38.x,local_38.y,local_38.z,local_38.d);
  return __return_storage_ptr__;
}

Assistant:

ON_PlaneEquation ON_PlaneEquation::UnitizedPlaneEquation() const
{
  if (IsSet())
  {
    // 15 September 2003 Dale Lear
    //     Added the ON_IS_FINITE and ON_DBL_MIN test.  See ON_3dVector::Length()
    //     for details.
    double dd = DirectionLength();

    if (ON_IS_FINITE(dd))
    {
      if (dd > ON_DBL_MIN)
      {
        return ON_PlaneEquation(x / dd, y / dd, z / dd, d / dd);
      }

      if (dd > 0.0)
      {
        // This code is rarely used and can be slow.
        // It multiplies by 2^1023 in an attempt to 
        // normalize the coordinates.
        // If the renormalization works, then we're
        // ok.  If the renormalization fails, we
        // return false.
        ON_PlaneEquation tmp(
          x*8.9884656743115795386465259539451e+307,
          y*8.9884656743115795386465259539451e+307,
          z*8.9884656743115795386465259539451e+307,
          d*8.9884656743115795386465259539451e+307
          );
        dd = tmp.DirectionLength();
        if (ON_IS_FINITE(dd) && dd > ON_DBL_MIN)
        {
          return ON_PlaneEquation(tmp.x / dd, tmp.y / dd, tmp.z / dd, tmp.d / dd);
        }
      }
    }
  }
  else if ( d == ON_UNSET_VALUE )
  {
    ON_3dVector v = Direction();
    if (v.IsValid() && v.Unitize())
    {
      return ON_PlaneEquation(v.x, v.y, v.z, ON_UNSET_VALUE);
    }
  }

  return ON_PlaneEquation::ZeroPlaneEquation;
}